

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O1

float Vector3Angle(Vector3 v1,Vector3 v2)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  fVar7 = v2.z;
  fVar5 = v2.x;
  fVar6 = v2.y;
  fVar4 = v1.z;
  fVar2 = v1.x;
  fVar3 = v1.y;
  fVar8 = fVar3 * fVar7 - fVar6 * fVar4;
  fVar9 = fVar4 * fVar5 - fVar2 * fVar7;
  fVar1 = fVar6 * fVar2 - fVar3 * fVar5;
  fVar1 = fVar1 * fVar1 + fVar8 * fVar8 + fVar9 * fVar9;
  if (fVar1 < 0.0) {
    fVar1 = sqrtf(fVar1);
  }
  else {
    fVar1 = SQRT(fVar1);
  }
  fVar2 = atan2f(fVar1,fVar4 * fVar7 + fVar2 * fVar5 + fVar3 * fVar6);
  return fVar2;
}

Assistant:

RMAPI float Vector3Angle(Vector3 v1, Vector3 v2)
{
    float result = 0.0f;

    Vector3 cross = { v1.y*v2.z - v1.z*v2.y, v1.z*v2.x - v1.x*v2.z, v1.x*v2.y - v1.y*v2.x };
    float len = sqrtf(cross.x*cross.x + cross.y*cross.y + cross.z*cross.z);
    float dot = (v1.x*v2.x + v1.y*v2.y + v1.z*v2.z);
    result = atan2f(len, dot);

    return result;
}